

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

int bcf_sr_set_samples(bcf_srs_t *files,char *fname,int is_file)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  long lVar5;
  void *local_60;
  bcf_sr_t *reader;
  int n_isec;
  void *exclude;
  char **smpl;
  int local_30;
  int free_smpl;
  int nsmpl;
  int j;
  int i;
  int is_file_local;
  char *fname_local;
  bcf_srs_t *files_local;
  
  bVar1 = false;
  exclude = (void *)0x0;
  j = is_file;
  _i = fname;
  fname_local = (char *)files;
  if (*fname == '^') {
    local_60 = khash_str2int_init();
  }
  else {
    local_60 = (void *)0x0;
  }
  if ((local_60 != (void *)0x0) || (iVar2 = strcmp("-",_i), iVar2 != 0)) {
    exclude = hts_readlist(_i,j,&local_30);
    if ((char **)exclude == (char **)0x0) {
      fprintf(_stderr,"Could not read the file: \"%s\"\n",_i);
      return 0;
    }
    if (local_60 != (void *)0x0) {
      for (nsmpl = 0; nsmpl < local_30; nsmpl = nsmpl + 1) {
        khash_str2int_inc(local_60,*(char **)((long)exclude + (long)nsmpl * 8));
      }
    }
    bVar1 = true;
  }
  if (exclude == (void *)0x0) {
    exclude = *(void **)(*(long *)(*(long *)(fname_local + 0x28) + 0x18) + 0x40);
    local_30 = *(int *)(*(long *)(*(long *)(fname_local + 0x28) + 0x18) + 8);
  }
  fname_local[0x40] = '\0';
  fname_local[0x41] = '\0';
  fname_local[0x42] = '\0';
  fname_local[0x43] = '\0';
  fname_local[0x44] = '\0';
  fname_local[0x45] = '\0';
  fname_local[0x46] = '\0';
  fname_local[0x47] = '\0';
  fname_local[0x78] = '\0';
  fname_local[0x79] = '\0';
  fname_local[0x7a] = '\0';
  fname_local[0x7b] = '\0';
  for (nsmpl = 0; nsmpl < local_30; nsmpl = nsmpl + 1) {
    if ((local_60 == (void *)0x0) ||
       (iVar2 = khash_str2int_has_key(local_60,*(char **)((long)exclude + (long)nsmpl * 8)),
       iVar2 == 0)) {
      reader._4_4_ = 0;
      free_smpl = 0;
      while ((free_smpl < *(int *)(fname_local + 0x30) &&
             (iVar2 = bcf_hdr_id2int(*(bcf_hdr_t **)
                                      (*(long *)(fname_local + 0x28) + (long)free_smpl * 0x60 + 0x18
                                      ),2,*(char **)((long)exclude + (long)nsmpl * 8)), -1 < iVar2))
            ) {
        reader._4_4_ = reader._4_4_ + 1;
        free_smpl = free_smpl + 1;
      }
      if (reader._4_4_ == *(int *)(fname_local + 0x30)) {
        pvVar3 = realloc(*(void **)(fname_local + 0x40),
                         (long)(*(int *)(fname_local + 0x78) + 1) << 3);
        *(void **)(fname_local + 0x40) = pvVar3;
        pcVar4 = strdup(*(char **)((long)exclude + (long)nsmpl * 8));
        iVar2 = *(int *)(fname_local + 0x78);
        *(int *)(fname_local + 0x78) = iVar2 + 1;
        *(char **)(*(long *)(fname_local + 0x40) + (long)iVar2 * 8) = pcVar4;
      }
      else {
        fprintf(_stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n",
                *(undefined8 *)((long)exclude + (long)nsmpl * 8),
                *(undefined8 *)(*(long *)(fname_local + 0x28) + (long)reader._4_4_ * 0x60 + 0x28));
      }
    }
  }
  if (local_60 != (void *)0x0) {
    khash_str2int_destroy(local_60);
  }
  if (bVar1) {
    for (nsmpl = 0; nsmpl < local_30; nsmpl = nsmpl + 1) {
      free(*(void **)((long)exclude + (long)nsmpl * 8));
    }
    free(exclude);
  }
  if (*(int *)(fname_local + 0x78) == 0) {
    if (1 < *(int *)(fname_local + 0x30)) {
      fprintf(_stderr,"No samples in common.\n");
    }
    files_local._4_4_ = 0;
  }
  else {
    for (nsmpl = 0; nsmpl < *(int *)(fname_local + 0x30); nsmpl = nsmpl + 1) {
      lVar5 = *(long *)(fname_local + 0x28) + (long)nsmpl * 0x60;
      pvVar3 = malloc((long)*(int *)(fname_local + 0x78) << 2);
      *(void **)(lVar5 + 0x50) = pvVar3;
      *(undefined4 *)(lVar5 + 0x58) = *(undefined4 *)(fname_local + 0x78);
      for (free_smpl = 0; free_smpl < *(int *)(fname_local + 0x78); free_smpl = free_smpl + 1) {
        iVar2 = bcf_hdr_id2int(*(bcf_hdr_t **)(lVar5 + 0x18),2,
                               *(char **)(*(long *)(fname_local + 0x40) + (long)free_smpl * 8));
        *(int *)(*(long *)(lVar5 + 0x50) + (long)free_smpl * 4) = iVar2;
      }
    }
    files_local._4_4_ = 1;
  }
  return files_local._4_4_;
}

Assistant:

int bcf_sr_set_samples(bcf_srs_t *files, const char *fname, int is_file)
{
    int i, j, nsmpl, free_smpl = 0;
    char **smpl = NULL;

    void *exclude = (fname[0]=='^') ? khash_str2int_init() : NULL;
    if ( exclude || strcmp("-",fname) ) // "-" stands for all samples
    {
        smpl = hts_readlist(fname, is_file, &nsmpl);
        if ( !smpl )
        {
            fprintf(stderr,"Could not read the file: \"%s\"\n", fname);
            return 0;
        }
        if ( exclude )
        {
            for (i=0; i<nsmpl; i++)
                khash_str2int_inc(exclude, smpl[i]);
        }
        free_smpl = 1;
    }
    if ( !smpl )
    {
        smpl  = files->readers[0].header->samples;   // intersection of all samples
        nsmpl = bcf_hdr_nsamples(files->readers[0].header);
    }

    files->samples = NULL;
    files->n_smpl  = 0;
    for (i=0; i<nsmpl; i++)
    {
        if ( exclude && khash_str2int_has_key(exclude,smpl[i])  ) continue;

        int n_isec = 0;
        for (j=0; j<files->nreaders; j++)
        {
            if ( bcf_hdr_id2int(files->readers[j].header, BCF_DT_SAMPLE, smpl[i])<0 ) break;
            n_isec++;
        }
        if ( n_isec!=files->nreaders )
        {
            fprintf(stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n", smpl[i], files->readers[n_isec].fname);
            continue;
        }

        files->samples = (char**) realloc(files->samples, (files->n_smpl+1)*sizeof(const char*));
        files->samples[files->n_smpl++] = strdup(smpl[i]);
    }

    if ( exclude ) khash_str2int_destroy(exclude);
    if ( free_smpl )
    {
        for (i=0; i<nsmpl; i++) free(smpl[i]);
        free(smpl);
    }

    if ( !files->n_smpl )
    {
        if ( files->nreaders>1 )
            fprintf(stderr,"No samples in common.\n");
        return 0;
    }
    for (i=0; i<files->nreaders; i++)
    {
        bcf_sr_t *reader = &files->readers[i];
        reader->samples  = (int*) malloc(sizeof(int)*files->n_smpl);
        reader->n_smpl   = files->n_smpl;
        for (j=0; j<files->n_smpl; j++)
            reader->samples[j] = bcf_hdr_id2int(reader->header, BCF_DT_SAMPLE, files->samples[j]);
    }
    return 1;
}